

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ticket_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  uint16_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  
  bVar3 = true;
  if (contents != (CBS *)0x0) {
    ssl = hs->ssl;
    uVar1 = ssl_protocol_version(ssl);
    if (uVar1 < 0x304) {
      uVar2 = SSL_get_options(ssl);
      if ((uVar2 >> 0xe & 1) != 0) {
        __assert_fail("(SSL_get_options(ssl) & SSL_OP_NO_TICKET) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x3c0,
                      "bool bssl::ext_ticket_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      if (contents->len == 0) {
        hs->field_0x6ca = hs->field_0x6ca | 1;
        return true;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool ext_ticket_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                         CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // If |SSL_OP_NO_TICKET| is set then no extension will have been sent and
  // this function should never be called, even if the server tries to send the
  // extension.
  assert((SSL_get_options(ssl) & SSL_OP_NO_TICKET) == 0);

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->ticket_expected = true;
  return true;
}